

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cpp
# Opt level: O0

void __thiscall Gluco::SimpSolver::garbageCollect(SimpSolver *this)

{
  uint32_t uVar1;
  uint32_t uVar2;
  ClauseAllocator *this_00;
  undefined1 local_28 [8];
  ClauseAllocator to;
  SimpSolver *this_local;
  
  this_00 = &(this->super_Solver).ca;
  to.super_RegionAllocator<unsigned_int>._16_8_ = this;
  uVar1 = RegionAllocator<unsigned_int>::size(&this_00->super_RegionAllocator<unsigned_int>);
  uVar2 = RegionAllocator<unsigned_int>::wasted(&this_00->super_RegionAllocator<unsigned_int>);
  ClauseAllocator::ClauseAllocator((ClauseAllocator *)local_28,uVar1 - uVar2);
  cleanUpClauses(this);
  to.super_RegionAllocator<unsigned_int>.cap._0_1_ =
       (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.field_0x14 & 1;
  relocAll(this,(ClauseAllocator *)local_28);
  Solver::relocAll(&this->super_Solver,(ClauseAllocator *)local_28);
  if (1 < (this->super_Solver).verbosity) {
    uVar1 = RegionAllocator<unsigned_int>::size
                      (&(this->super_Solver).ca.super_RegionAllocator<unsigned_int>);
    uVar2 = RegionAllocator<unsigned_int>::size((RegionAllocator<unsigned_int> *)local_28);
    printf("|  Garbage collection:   %12d bytes => %12d bytes             |\n",(ulong)(uVar1 << 2),
           (ulong)(uVar2 << 2));
  }
  ClauseAllocator::moveTo((ClauseAllocator *)local_28,&(this->super_Solver).ca);
  ClauseAllocator::~ClauseAllocator((ClauseAllocator *)local_28);
  return;
}

Assistant:

void SimpSolver::garbageCollect()
{
    // Initialize the next region to a size corresponding to the estimated utilization degree. This
    // is not precise but should avoid some unnecessary reallocations for the new region:
    ClauseAllocator to(ca.size() - ca.wasted()); 

    cleanUpClauses();
    to.extra_clause_field = ca.extra_clause_field; // NOTE: this is important to keep (or lose) the extra fields.
    relocAll(to);
    Solver::relocAll(to);
    if (verbosity >= 2)
        printf("|  Garbage collection:   %12d bytes => %12d bytes             |\n", 
               ca.size()*ClauseAllocator::Unit_Size, to.size()*ClauseAllocator::Unit_Size);
    to.moveTo(ca);
}